

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::anon_unknown_15::operator<<(ostream *os,XmlEncode *xmlEncode)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  byte c;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  uVar3 = 0;
  do {
    uVar9 = (xmlEncode->m_str)._M_string_length;
    if (uVar9 <= uVar3) {
      return os;
    }
    pcVar1 = (xmlEncode->m_str)._M_dataplus._M_p;
    c = pcVar1[uVar3];
    if (c == 0x22) {
      if (xmlEncode->m_forWhat == ForAttributes) {
        pcVar4 = "&quot;";
        goto LAB_0010dacc;
      }
      c = 0x22;
LAB_0010db06:
      std::operator<<(os,c);
    }
    else {
      if (c == 0x26) {
        pcVar4 = "&amp;";
      }
      else if (c == 0x3e) {
        if (((uVar3 < 3) || (pcVar1[uVar3 - 1] != ']')) || (pcVar1[uVar3 - 2] != ']')) {
          c = 0x3e;
          goto LAB_0010db06;
        }
        pcVar4 = "&gt;";
      }
      else {
        if (c != 0x3c) {
          if ((8 < c) && (c != 0x7f && 0x11 < (byte)(c - 0xe))) {
            if (c < 0x7f) goto LAB_0010db06;
            if (199 < (byte)(c + 8)) {
              if ((c & 0xe0) == 0xc0) {
                lVar8 = 2;
                uVar2 = 0x1f;
                if (uVar3 + 1 < uVar9) {
LAB_0010db80:
                  uVar5 = (byte)pcVar1[uVar3 + 1] & 0xffffffc0;
                  bVar11 = uVar5 == 0x80;
                  uVar2 = (byte)pcVar1[uVar3 + 1] & 0x3f | (uVar2 & c) << 6;
                  uVar6 = (uint)lVar8;
                  if (2 < uVar6) {
                    bVar11 = ((byte)pcVar1[uVar3 + 2] & 0xffffffc0) == 0x80 && uVar5 == 0x80;
                    uVar2 = (byte)pcVar1[uVar3 + 2] & 0x3f | uVar2 << 6;
                    if (uVar6 != 3) {
                      bVar11 = bVar11 && ((byte)pcVar1[uVar3 + 3] & 0xffffffc0) == 0x80;
                      uVar2 = (byte)pcVar1[uVar3 + 3] & 0x3f | uVar2 << 6;
                    }
                  }
                  if ((((bVar11) && (0x7f < uVar2)) && ((uVar6 < 3 || (0x7ff < uVar2)))) &&
                     ((uVar6 < 4 || 0xf7fe < uVar2 - 0x801 &&
                      (uVar9 = uVar3, lVar10 = lVar8, uVar2 < 0x110000)))) {
                    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
                      std::operator<<(os,(xmlEncode->m_str)._M_dataplus._M_p[uVar9]);
                      uVar9 = uVar9 + 1;
                    }
                    uVar3 = (uVar3 + lVar8) - 1;
                  }
                  else {
                    anon_unknown_36::hexEscapeChar(os,c);
                  }
                  goto LAB_0010db0b;
                }
              }
              else {
                uVar2 = c & 0xfffffff0;
                uVar7 = (ulong)(uVar2 != 0xe0);
                if (uVar7 + uVar3 + 2 < uVar9) {
                  lVar8 = uVar7 + 3;
                  uVar2 = (uint)(uVar2 == 0xe0) * 8 + 7;
                  goto LAB_0010db80;
                }
              }
            }
          }
          anon_unknown_36::hexEscapeChar(os,c);
          goto LAB_0010db0b;
        }
        pcVar4 = "&lt;";
      }
LAB_0010dacc:
      std::operator<<(os,pcVar4);
    }
LAB_0010db0b:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::ostream& operator << ( std::ostream& os, XmlEncode const& xmlEncode ) {
        xmlEncode.encodeTo( os );
        return os;
    }